

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileStream.cpp
# Opt level: O1

RefCntAutoPtr<Diligent::BasicFileStream>
Diligent::BasicFileStream::Create(Char *Path,EFileAccessMode Access)

{
  BasicFileStream *pObj;
  char *in_RSI;
  BasicFileStream *in_RDI;
  string msg;
  EFileAccessMode local_44;
  char *local_40;
  string local_38;
  undefined4 local_18;
  
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    FormatString<char[31]>(&local_38,(char (*) [31])"Path must not be null or empty");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/BasicFileStream.cpp"
               ,0x26);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    (in_RDI->super_ObjectBase<Diligent::IFileStream>).super_RefCountedObject<Diligent::IFileStream>.
    super_IFileStream.super_IObject._vptr_IObject = (_func_int **)0x0;
  }
  else {
    local_38.field_2._M_allocated_capacity = 0;
    local_38.field_2._8_8_ = 0;
    local_38._M_dataplus._M_p = (pointer)0x0;
    local_38._M_string_length = 0;
    local_18 = 0;
    pObj = MakeNewRCObj<Diligent::BasicFileStream,Diligent::IMemoryAllocator>::operator()
                     (&local_38,&local_40,&local_44);
    RefCntAutoPtr<Diligent::BasicFileStream>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BasicFileStream> *)in_RDI,pObj);
  }
  return (RefCntAutoPtr<Diligent::BasicFileStream>)in_RDI;
}

Assistant:

RefCntAutoPtr<BasicFileStream> BasicFileStream::Create(const Char* Path, EFileAccessMode Access)
{
    if (Path == nullptr || Path[0] == '\0')
    {
        DEV_ERROR("Path must not be null or empty");
        return {};
    }

    return RefCntAutoPtr<BasicFileStream>{MakeNewRCObj<BasicFileStream>()(Path, Access)};
}